

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cc
# Opt level: O1

Info * __thiscall wabt::Opcode::GetInfo(Info *__return_storage_ptr__,Opcode *this)

{
  Enum EVar1;
  long lVar2;
  uint uVar3;
  undefined8 *puVar4;
  Info *pIVar5;
  
  EVar1 = this->enum_;
  if ((ulong)EVar1 < 0x21c) {
    puVar4 = (undefined8 *)(infos_ + (ulong)EVar1 * 0x48);
    pIVar5 = __return_storage_ptr__;
    for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
      pIVar5->name = (char *)*puVar4;
      puVar4 = puVar4 + 1;
      pIVar5 = (Info *)&pIVar5->decomp;
    }
    return __return_storage_ptr__;
  }
  puVar4 = (undefined8 *)(infos_ + 0x97e0);
  pIVar5 = __return_storage_ptr__;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    pIVar5->name = (char *)*puVar4;
    puVar4 = puVar4 + 1;
    pIVar5 = (Info *)&pIVar5->decomp;
  }
  uVar3 = -EVar1;
  __return_storage_ptr__->prefix = (uint8_t)(uVar3 >> 9);
  __return_storage_ptr__->code = uVar3 & 0xff;
  __return_storage_ptr__->prefix_code = uVar3 & 0x1feff;
  return __return_storage_ptr__;
}

Assistant:

Opcode::Info Opcode::GetInfo() const {
  if (enum_ < Invalid) {
    return infos_[enum_];
  }

  Info invalid_info = infos_[Opcode::Invalid];
  DecodeInvalidOpcode(enum_, &invalid_info.prefix, &invalid_info.code);
  invalid_info.prefix_code = PrefixCode(invalid_info.prefix, invalid_info.code);
  return invalid_info;
}